

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

PacketBuilder * __thiscall PacketBuilder::AddVar(PacketBuilder *this,int min,int max,int num)

{
  size_t throwaway;
  _Type local_20 [2];
  
  if (min < 2) {
    if (max < 2 || (uint)num < 0xfd) {
      PacketProcessor::ENumber(num,(size_t *)local_20);
      std::__cxx11::string::push_back((char)this + '\b');
      return this;
    }
LAB_00180036:
    if (max < 3 || (uint)num < 0xfa09) {
      local_20[0] = (_Type)PacketProcessor::ENumber(num,(size_t *)local_20);
      goto LAB_001800c7;
    }
LAB_00180072:
    if (max < 4 || (uint)num < 0xf71ae5) {
      local_20[0] = (_Type)PacketProcessor::ENumber(num,(size_t *)local_20);
      goto LAB_001800c7;
    }
  }
  else {
    if (min == 2) goto LAB_00180036;
    if ((uint)min < 4) goto LAB_00180072;
  }
  local_20[0] = (_Type)PacketProcessor::ENumber(num,(size_t *)local_20);
LAB_001800c7:
  std::__cxx11::string::append((char *)&this->data,(ulong)local_20);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddVar(int min, int max, int num)
{
	if (min <= 1 && (max <= 1 || num < PacketProcessor::MAX1))
		this->AddChar(num);
	else if (min <= 2 && (max <= 2 || num < PacketProcessor::MAX2))
		this->AddShort(num);
	else if (min <= 3 && (max <= 3 || num < PacketProcessor::MAX3))
		this->AddThree(num);
	else
		this->AddInt(num);

	return *this;
}